

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O3

LOs __thiscall Omega_h::offset_scan<int>(Omega_h *this,Read<int> *a,string *name)

{
  Alloc **ppAVar1;
  int *piVar2;
  undefined8 uVar3;
  long *plVar4;
  ulong *puVar5;
  int iVar6;
  void *extraout_RDX;
  size_t sVar7;
  ulong uVar8;
  Alloc *pAVar9;
  ulong uVar10;
  long lVar11;
  LOs LVar12;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> out;
  string __str;
  ScopedTimer local_c9;
  Write<int> local_c8;
  Alloc local_b8;
  Alloc **local_70;
  long local_68;
  Alloc *local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,"");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  ppAVar1 = &local_b8.prev;
  puVar5 = (ulong *)(plVar4 + 2);
  if ((Alloc **)*plVar4 == (Alloc **)puVar5) {
    local_b8.prev = (Alloc *)*puVar5;
    local_b8.next = (Alloc *)plVar4[3];
    local_b8.ptr = ppAVar1;
  }
  else {
    local_b8.prev = (Alloc *)*puVar5;
    local_b8.ptr = (Alloc **)*plVar4;
  }
  local_b8._48_8_ = plVar4[1];
  *plVar4 = (long)puVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x02');
  *(undefined2 *)local_70 = 0x3231;
  pAVar9 = (Alloc *)0xf;
  if ((Alloc **)local_b8.ptr != ppAVar1) {
    pAVar9 = local_b8.prev;
  }
  if (pAVar9 < (Alloc *)(local_68 + local_b8._48_8_)) {
    pAVar9 = (Alloc *)0xf;
    if (local_70 != local_60) {
      pAVar9 = local_60[0];
    }
    if ((Alloc *)(local_68 + local_b8._48_8_) <= pAVar9) {
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_70,0,(char *)0x0,(ulong)local_b8.ptr);
      goto LAB_002f0504;
    }
  }
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_b8.ptr,(ulong)local_70);
LAB_002f0504:
  local_c8.shared_alloc_.alloc = &local_b8;
  pAVar9 = (Alloc *)(plVar4 + 2);
  if ((Alloc *)*plVar4 == pAVar9) {
    local_b8.size = pAVar9->size;
    local_b8.name._M_dataplus._M_p = (pointer)plVar4[3];
  }
  else {
    local_b8.size = pAVar9->size;
    local_c8.shared_alloc_.alloc = (Alloc *)*plVar4;
  }
  local_c8.shared_alloc_.direct_ptr = (void *)plVar4[1];
  *plVar4 = (long)pAVar9;
  plVar4[1] = 0;
  *(undefined1 *)&pAVar9->size = 0;
  begin_code("offset_scan",(char *)local_c8.shared_alloc_.alloc);
  if (local_c8.shared_alloc_.alloc != &local_b8) {
    operator_delete(local_c8.shared_alloc_.alloc,local_b8.size + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,(ulong)((long)&local_60[0]->size + 1));
  }
  if ((Alloc **)local_b8.ptr != ppAVar1) {
    operator_delete(local_b8.ptr,(ulong)((long)&(local_b8.prev)->size + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar9 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar9 & 1) == 0) {
    sVar7 = pAVar9->size;
  }
  else {
    sVar7 = (ulong)pAVar9 >> 3;
  }
  Write<int>::Write(&local_c8,(int)(sVar7 >> 2) + 1,name);
  Write<int>::set(&local_c8,0,0);
  pAVar9 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar9 & 1) == 0) {
    sVar7 = pAVar9->size;
  }
  else {
    sVar7 = (ulong)pAVar9 >> 3;
  }
  uVar10 = (ulong)(int)(sVar7 >> 2);
  if (0 < (long)uVar10) {
    piVar2 = (int *)(a->write_).shared_alloc_.direct_ptr;
    iVar6 = *piVar2;
    *(int *)((long)local_c8.shared_alloc_.direct_ptr + 4) = iVar6;
    if ((sVar7 & 0x3fffffffc) != 4) {
      uVar8 = 2;
      if (2 < uVar10) {
        uVar8 = uVar10;
      }
      lVar11 = 0;
      do {
        iVar6 = iVar6 + piVar2[lVar11 + 1];
        *(int *)((long)local_c8.shared_alloc_.direct_ptr + lVar11 * 4 + 8) = iVar6;
        lVar11 = lVar11 + 1;
      } while (uVar8 - 1 != lVar11);
    }
  }
  local_b8.name.field_2._M_allocated_capacity = (size_type)local_c8.shared_alloc_.alloc;
  local_b8.name.field_2._8_8_ = local_c8.shared_alloc_.direct_ptr;
  if ((((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
       local_c8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + -1;
    local_b8.name.field_2._M_allocated_capacity = (local_c8.shared_alloc_.alloc)->size * 8 + 1;
  }
  local_c8.shared_alloc_.alloc = (Alloc *)0x0;
  local_c8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_b8.name.field_2);
  uVar3 = local_b8.name.field_2._M_allocated_capacity;
  if ((local_b8.name.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_b8.name.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar2 = (int *)(local_b8.name.field_2._M_allocated_capacity + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_b8.name.field_2._M_allocated_capacity);
      operator_delete((void *)uVar3,0x48);
    }
  }
  pAVar9 = local_c8.shared_alloc_.alloc;
  if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 && local_c8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_c8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c8.shared_alloc_.alloc);
      operator_delete(pAVar9,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_c9);
  LVar12.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar12.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar12.write_.shared_alloc_;
}

Assistant:

LOs offset_scan(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  Write<LO> out(a.size() + 1, name);
  out.set(0, 0);
  auto const first = CastIterator<LO, T>(a.begin());
  auto const last = CastIterator<LO, T>(a.end());
  auto const result = out.begin() + 1;
  inclusive_scan(first, last, result);
  return out;
}